

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::RasterizationSamplesTest::createMultisampleTestInstance
          (RasterizationSamplesTest *this,Context *context,VkPrimitiveTopology topology,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices,
          VkPipelineMultisampleStateCreateInfo *multisampleStateParams,
          VkPipelineColorBlendAttachmentState *colorBlendState)

{
  RasterizationSamplesInstance *this_00;
  VkPipelineColorBlendAttachmentState *colorBlendState_local;
  VkPipelineMultisampleStateCreateInfo *multisampleStateParams_local;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices_local;
  VkPrimitiveTopology topology_local;
  Context *context_local;
  RasterizationSamplesTest *this_local;
  
  this_00 = (RasterizationSamplesInstance *)operator_new(0x68);
  RasterizationSamplesInstance::RasterizationSamplesInstance
            (this_00,context,topology,vertices,multisampleStateParams,colorBlendState,
             this->m_modeFlags);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* RasterizationSamplesTest::createMultisampleTestInstance (Context&										context,
																	   VkPrimitiveTopology							topology,
																	   const std::vector<Vertex4RGBA>&				vertices,
																	   const VkPipelineMultisampleStateCreateInfo&	multisampleStateParams,
																	   const VkPipelineColorBlendAttachmentState&	colorBlendState) const
{
	return new RasterizationSamplesInstance(context, topology, vertices, multisampleStateParams, colorBlendState, m_modeFlags);
}